

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  uint in_EDX;
  long in_RDI;
  ImVec2 offset;
  ImVec2 old_pos;
  ImVec2 *in_stack_ffffffffffffffb8;
  bool local_39;
  ImVec2 local_38;
  ImVec2 local_30;
  undefined8 local_28;
  ImVec2 local_1c [2];
  long local_8;
  
  if ((in_EDX == 0) || ((*(uint *)(in_RDI + 0xa4) & in_EDX) != 0)) {
    local_39 = true;
    local_8 = in_RDI;
    if (in_EDX != 0) {
      local_39 = ImIsPowerOfTwo(in_EDX);
    }
    if (local_39 == false) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1908,"void ImGui::SetWindowPos(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
    *(uint *)(local_8 + 0xa4) = *(uint *)(local_8 + 0xa4) & 0xfffffff1;
    ImVec2::ImVec2(local_1c,3.4028235e+38,3.4028235e+38);
    *(ImVec2 *)(local_8 + 0xb0) = local_1c[0];
    local_28 = *(undefined8 *)(local_8 + 0x10);
    local_30 = ImFloor(in_stack_ffffffffffffffb8);
    *(ImVec2 *)(local_8 + 0x10) = local_30;
    local_38 = ::operator-(in_stack_ffffffffffffffb8,(ImVec2 *)0x1eb930);
    operator+=((ImVec2 *)(local_8 + 0xd0),&local_38);
    operator+=((ImVec2 *)(local_8 + 0xe8),&local_38);
    operator+=((ImVec2 *)(local_8 + 0xe0),&local_38);
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.CursorStartPos += offset;
}